

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<absl::lts_20250127::Cord>::GrowNoAnnotate
          (RepeatedField<absl::lts_20250127::Cord> *this,bool was_soo,int old_size,int new_size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  SooRep *this_00;
  Arena *this_01;
  HeapRep *pHVar4;
  undefined8 *puVar5;
  Cord *pCVar6;
  LogMessage *this_02;
  Nonnull<const_char_*> pcVar7;
  undefined7 in_register_00000031;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long in_FS_OFFSET;
  string_view str;
  undefined1 auVar12 [16];
  int local_4c;
  LogMessage local_48;
  SooRep *local_38;
  
  pcVar7 = (Nonnull<const_char_*>)0x0;
  iVar9 = 0;
  if ((int)CONCAT71(in_register_00000031,was_soo) == 0) {
    iVar9 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (new_size <= iVar9) {
    pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)new_size,(long)iVar9,"new_size > old_capacity");
  }
  if (pcVar7 != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x4ad,pcVar7);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    this_01 = protobuf::internal::SooRep::soo_arena(&this->soo_rep_);
  }
  else {
    pHVar4 = heap_rep(this);
    this_01 = (pHVar4->field_0).arena;
  }
  if (new_size < 1) {
    new_size = 1;
  }
  else if (iVar9 < 0x3ffffff8) {
    if (iVar9 < 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x493,"capacity == 0 || capacity >= lower_limit");
      local_4c = iVar9;
      this_02 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                          (&local_48,&local_4c);
      str._M_str = " ";
      str._M_len = 1;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_02,str);
      local_4c = 1;
      absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(this_02,&local_4c);
      goto LAB_0093eaf6;
    }
    iVar9 = iVar9 * 2 + 1;
    if (new_size < iVar9) {
      new_size = iVar9;
    }
  }
  else {
    new_size = 0x7fffffff;
  }
  uVar8 = (ulong)new_size;
  uVar10 = uVar8 * 0x10;
  local_38 = &this->soo_rep_;
  if (this_01 == (Arena *)0x0) {
    if ((uVar8 & 0xfffffff80000000) == 0) {
      pcVar7 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                         (uVar8 & 0xfffffffffffffff,0x7fffffff,
                          "(bytes - kHeapRepHeaderSize) / sizeof(Element) <= static_cast<size_t>(std::numeric_limits<int>::max())"
                         );
    }
    if (pcVar7 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4bc,pcVar7);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&local_48,
                 (char (*) [59])"Requested size is too large to fit element count into int.");
LAB_0093eaf6:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_48);
    }
    if (*(code **)(in_FS_OFFSET + -0x48) == (code *)0x0) {
      puVar5 = (undefined8 *)operator_new(uVar10 + 0x10);
    }
    else {
      auVar12 = (**(code **)(in_FS_OFFSET + -0x48))
                          (uVar10 + 0x10,*(undefined8 *)(in_FS_OFFSET + -0x40));
      puVar5 = auVar12._0_8_;
      uVar10 = auVar12._8_8_ - 0x10;
    }
    uVar10 = uVar10 >> 4;
    if (0x7ffffffe < uVar10) {
      uVar10 = 0x7fffffff;
    }
    new_size = (int)uVar10;
  }
  else {
    puVar5 = (undefined8 *)Arena::AllocateForArray(this_01,uVar10 + 0x10);
  }
  *puVar5 = this_01;
  if (0 < old_size) {
    pCVar6 = elements((RepeatedField<absl::lts_20250127::Cord> *)local_38,was_soo);
    lVar11 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(pCVar6->contents_).data_.rep_.field_0 + lVar11);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)puVar5 + lVar11 + 0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      puVar1 = (undefined8 *)((long)&(pCVar6->contents_).data_.rep_.field_0 + lVar11);
      *puVar1 = 0;
      puVar1[1] = 0;
      absl::lts_20250127::Cord::~Cord
                ((Cord *)((long)&(pCVar6->contents_).data_.rep_.field_0 + lVar11));
      lVar11 = lVar11 + 0x10;
    } while ((ulong)(uint)old_size << 4 != lVar11);
  }
  this_00 = local_38;
  if (!was_soo) {
    InternalDeallocate<false>((RepeatedField<absl::lts_20250127::Cord> *)local_38);
  }
  protobuf::internal::SooRep::set_non_soo(this_00,was_soo,new_size,puVar5 + 2);
  return;
}

Assistant:

PROTOBUF_NOINLINE void RepeatedField<Element>::GrowNoAnnotate(bool was_soo,
                                                              int old_size,
                                                              int new_size) {
  const int old_capacity = Capacity(was_soo);
  ABSL_DCHECK_GT(new_size, old_capacity);
  HeapRep* new_rep;
  Arena* arena = GetArena();

  new_size = internal::CalculateReserveSize<Element, kHeapRepHeaderSize>(
      old_capacity, new_size);

  ABSL_DCHECK_LE(static_cast<size_t>(new_size),
                 (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) /
                     sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kHeapRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == nullptr) {
    ABSL_DCHECK_LE((bytes - kHeapRepHeaderSize) / sizeof(Element),
                   static_cast<size_t>(std::numeric_limits<int>::max()))
        << "Requested size is too large to fit element count into int.";
    internal::SizedPtr res = internal::AllocateAtLeast(bytes);
    size_t num_available =
        std::min((res.n - kHeapRepHeaderSize) / sizeof(Element),
                 static_cast<size_t>(std::numeric_limits<int>::max()));
    new_size = static_cast<int>(num_available);
    new_rep = static_cast<HeapRep*>(res.p);
  } else {
    new_rep =
        reinterpret_cast<HeapRep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;

  if (old_size > 0) {
    Element* pnew = static_cast<Element*>(new_rep->elements());
    Element* pold = elements(was_soo);
    // TODO: add absl::is_trivially_relocatable<Element>
    if (std::is_trivial<Element>::value) {
      memcpy(static_cast<void*>(pnew), pold, old_size * sizeof(Element));
    } else {
      for (Element* end = pnew + old_size; pnew != end; ++pnew, ++pold) {
        ::new (static_cast<void*>(pnew)) Element(std::move(*pold));
        pold->~Element();
      }
    }
  }
  if (!was_soo) InternalDeallocate();

  soo_rep_.set_non_soo(was_soo, new_size, new_rep->elements());
}